

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  long unaff_RBX;
  uint uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  int expTmp;
  uint local_fc;
  uint local_f8;
  int local_f4;
  long local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float *local_d8;
  float *local_d0;
  BeagleCPU4StateImpl<float,_1,_0> *local_c8;
  float *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (0 < (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount) {
    local_f0 = 0;
    local_f4 = 0;
    local_d8 = matrices1;
    local_d0 = matrices2;
    local_c8 = this;
    local_c0 = destP;
    do {
      if (0 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount) {
        auVar19 = vpbroadcastq_avx512vl();
        auVar17 = vpaddq_avx(auVar19._0_16_,_DAT_00141bb0);
        auVar3 = vpermq_avx2(ZEXT1632(auVar17),0xd0);
        auVar3 = vpblendd_avx2(auVar3,auVar19,3);
        auVar20 = vpbroadcastq_avx512vl();
        vpblendd_avx2(auVar3,auVar20,0xc0);
        local_48 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + local_f0 * 0x14));
        auVar23 = ZEXT1664(local_48);
        vpaddq_avx2(auVar19,_DAT_00141bc0);
        local_58 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + (long)activateScaling));
        auVar24 = ZEXT1664(local_58);
        vpaddq_avx2(auVar19,_DAT_00141be0);
        local_68 = vgatherqps_avx512vl(*(undefined8 *)(local_d8 + unaff_RBX));
        auVar25 = ZEXT1664(local_68);
        vpaddq_avx2(auVar19,_DAT_00141c00);
        local_78 = vgatherqps_avx512vl(*(undefined8 *)((long)local_d8 * 5));
        auVar26 = ZEXT1664(local_78);
        local_88 = vgatherqps_avx512vl(*(undefined8 *)(local_d0 + local_f0 * 0x14));
        auVar27 = ZEXT1664(local_88);
        local_98 = vgatherqps_avx512vl(*(undefined8 *)(local_d0 + (long)activateScaling));
        auVar28 = ZEXT1664(local_98);
        local_a8 = vgatherqps_avx512vl(*(undefined8 *)(local_d0 + unaff_RBX));
        auVar21 = ZEXT1664(local_a8);
        local_b8 = vgatherqps_avx512vl(*(undefined8 *)((long)local_d0 * 5));
        auVar22 = ZEXT1664(local_b8);
        unaff_RBX = (long)((this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * local_f4)
                    << 2;
        iVar16 = 0;
        do {
          uVar2 = *(undefined4 *)((long)partials1 + unaff_RBX + 4);
          auVar17._4_4_ = uVar2;
          auVar17._0_4_ = uVar2;
          auVar17._8_4_ = uVar2;
          auVar17._12_4_ = uVar2;
          auVar17 = vmulps_avx512vl(auVar24._0_16_,auVar17);
          uVar2 = *(undefined4 *)((long)partials1 + unaff_RBX);
          auVar18._4_4_ = uVar2;
          auVar18._0_4_ = uVar2;
          auVar18._8_4_ = uVar2;
          auVar18._12_4_ = uVar2;
          auVar17 = vfmadd231ps_avx512vl(auVar17,auVar23._0_16_,auVar18);
          uVar2 = *(undefined4 *)((long)partials1 + unaff_RBX + 8);
          auVar4._4_4_ = uVar2;
          auVar4._0_4_ = uVar2;
          auVar4._8_4_ = uVar2;
          auVar4._12_4_ = uVar2;
          auVar17 = vfmadd231ps_avx512vl(auVar17,auVar25._0_16_,auVar4);
          uVar2 = *(undefined4 *)((long)partials1 + unaff_RBX + 0xc);
          auVar5._4_4_ = uVar2;
          auVar5._0_4_ = uVar2;
          auVar5._8_4_ = uVar2;
          auVar5._12_4_ = uVar2;
          auVar17 = vfmadd231ps_avx512vl(auVar17,auVar26._0_16_,auVar5);
          uVar2 = *(undefined4 *)((long)partials2 + unaff_RBX + 4);
          auVar6._4_4_ = uVar2;
          auVar6._0_4_ = uVar2;
          auVar6._8_4_ = uVar2;
          auVar6._12_4_ = uVar2;
          auVar18 = vmulps_avx512vl(auVar28._0_16_,auVar6);
          uVar2 = *(undefined4 *)((long)partials2 + unaff_RBX);
          auVar7._4_4_ = uVar2;
          auVar7._0_4_ = uVar2;
          auVar7._8_4_ = uVar2;
          auVar7._12_4_ = uVar2;
          auVar18 = vfmadd231ps_avx512vl(auVar18,auVar27._0_16_,auVar7);
          uVar2 = *(undefined4 *)((long)partials2 + unaff_RBX + 8);
          auVar8._4_4_ = uVar2;
          auVar8._0_4_ = uVar2;
          auVar8._8_4_ = uVar2;
          auVar8._12_4_ = uVar2;
          auVar18 = vfmadd231ps_avx512vl(auVar18,auVar21._0_16_,auVar8);
          uVar2 = *(undefined4 *)((long)partials2 + unaff_RBX + 0xc);
          auVar9._4_4_ = uVar2;
          auVar9._0_4_ = uVar2;
          auVar9._8_4_ = uVar2;
          auVar9._12_4_ = uVar2;
          auVar18 = vfmadd231ps_avx512vl(auVar18,auVar22._0_16_,auVar9);
          local_e8 = auVar17._0_4_ * auVar18._0_4_;
          fStack_e4 = auVar17._4_4_ * auVar18._4_4_;
          fStack_e0 = auVar17._8_4_ * auVar18._8_4_;
          fStack_dc = auVar17._12_4_ * auVar18._12_4_;
          pfVar1 = (float *)((long)destP + unaff_RBX);
          *pfVar1 = local_e8;
          pfVar1[1] = fStack_e4;
          pfVar1[2] = fStack_e0;
          pfVar1[3] = fStack_dc;
          if (*activateScaling == 0) {
            frexp((double)local_e8,(int *)&local_fc);
            auVar10._4_4_ = fStack_e4;
            auVar10._0_4_ = local_e8;
            auVar10._8_4_ = fStack_e0;
            auVar10._12_4_ = fStack_dc;
            auVar17 = vmovshdup_avx(auVar10);
            frexp((double)auVar17._0_4_,(int *)&local_f8);
            uVar13 = -local_f8;
            if (0 < (int)local_f8) {
              uVar13 = local_f8;
            }
            uVar14 = -local_fc;
            if (0 < (int)local_fc) {
              uVar14 = local_fc;
            }
            uVar15 = local_fc;
            if (uVar14 < uVar13) {
              uVar15 = local_f8;
            }
            auVar11._4_4_ = fStack_e4;
            auVar11._0_4_ = local_e8;
            auVar11._8_4_ = fStack_e0;
            auVar11._12_4_ = fStack_dc;
            auVar17 = vpermilpd_avx(auVar11,1);
            frexp((double)auVar17._0_4_,(int *)&local_f8);
            uVar13 = -local_f8;
            if (0 < (int)local_f8) {
              uVar13 = local_f8;
            }
            uVar14 = -uVar15;
            if (0 < (int)uVar15) {
              uVar14 = uVar15;
            }
            if (uVar14 < uVar13) {
              uVar15 = local_f8;
            }
            auVar12._4_4_ = fStack_e4;
            auVar12._0_4_ = local_e8;
            auVar12._8_4_ = fStack_e0;
            auVar12._12_4_ = fStack_dc;
            auVar17 = vpermilps_avx(auVar12,0xff);
            frexp((double)auVar17._0_4_,(int *)&local_f8);
            uVar13 = -local_f8;
            if (0 < (int)local_f8) {
              uVar13 = local_f8;
            }
            uVar14 = -uVar15;
            if (0 < (int)uVar15) {
              uVar14 = uVar15;
            }
            local_fc = uVar15;
            if (uVar14 < uVar13) {
              local_fc = local_f8;
            }
            uVar13 = -local_fc;
            if (0 < (int)local_fc) {
              uVar13 = local_fc;
            }
            if ((local_c8->super_BeagleCPUImpl<float,_1,_0>).scalingExponentThreshold < (int)uVar13)
            {
              *activateScaling = 1;
            }
            auVar23 = ZEXT1664(local_48);
            auVar24 = ZEXT1664(local_58);
            auVar25 = ZEXT1664(local_68);
            auVar26 = ZEXT1664(local_78);
            auVar27 = ZEXT1664(local_88);
            auVar28 = ZEXT1664(local_98);
            auVar21 = ZEXT1664(local_a8);
            auVar22 = ZEXT1664(local_b8);
            destP = local_c0;
            this = local_c8;
          }
          iVar16 = iVar16 + 1;
          unaff_RBX = unaff_RBX + 0x10;
        } while (iVar16 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount);
      }
      local_f0 = local_f0 + 1;
      local_f4 = local_f4 + 4;
    } while (local_f0 < (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const REALTYPE* partials2,
                                                                    const REALTYPE* matrices2,
                                                                    int* activateScaling) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = 0; k < kPatternCount; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            if (*activateScaling == 0) {
                int expTmp;
                int expMax;
                frexp(destP[u], &expMax);
                frexp(destP[u + 1], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 2], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 3], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;

                if(abs(expMax) > scalingExponentThreshold) {
                    *activateScaling = 1;
                }
            }

            u += 4;

        }
    }
}